

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_decoder.c
# Opt level: O0

lzma_ret lzma_decode(lzma_coder_conflict8 *coder,lzma_dict *dictptr,uint8_t *in,size_t *in_pos,
                    size_t in_size)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  _Bool _Var6;
  byte bVar7;
  uint8_t byte;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  byte bVar12;
  bool bVar13;
  bool bVar14;
  uint local_114;
  uint32_t distance_2;
  uint32_t distance_1;
  uint32_t distance;
  uint32_t subcoder_index;
  uint32_t match_bit;
  uint uStack_cc;
  _Bool no_eopm;
  lzma_ret ret;
  uint32_t pos_state;
  uint32_t literal_context_bits;
  uint32_t literal_pos_mask;
  uint32_t len;
  uint32_t offset;
  uint32_t limit;
  uint32_t symbol;
  probability *probs;
  uint32_t local_a0;
  uint32_t pos_mask;
  uint32_t rep3;
  uint32_t rep2;
  uint32_t rep1;
  uint32_t rep0;
  uint32_t state;
  uint32_t rc_bound;
  size_t rc_in_pos;
  lzma_range_decoder rc;
  size_t dict_start;
  lzma_dict dict;
  size_t in_size_local;
  size_t *in_pos_local;
  uint8_t *in_local;
  lzma_dict *dictptr_local;
  lzma_coder_conflict8 *coder_local;
  
  dict._40_8_ = in_size;
  memcpy(&dict_start,dictptr,0x30);
  stack0xffffffffffffff90 = dict.buf;
  rc_in_pos._0_4_ = (coder->rc).range;
  rc_in_pos._4_4_ = (coder->rc).code;
  rc.range = (coder->rc).init_bytes_left;
  _state = *in_pos;
  rep1 = coder->state;
  rep2 = coder->rep0;
  rep3 = coder->rep1;
  pos_mask = coder->rep2;
  local_a0 = coder->rep3;
  probs._4_4_ = coder->pos_mask;
  _limit = (probability (*) [768])coder->probs;
  offset = coder->symbol;
  len = coder->limit;
  literal_pos_mask = coder->offset;
  literal_context_bits = coder->len;
  uVar1 = coder->literal_pos_mask;
  uVar2 = coder->literal_context_bits;
  uStack_cc = (uint)dict.buf & probs._4_4_;
  match_bit = 0;
  bVar14 = coder->uncompressed_size != 0xffffffffffffffff;
  if ((bVar14) && (coder->uncompressed_size < dict.full - (long)dict.buf)) {
    dict.full = (size_t)(dict.buf + coder->uncompressed_size);
  }
  _Var6 = rc_read_init(&coder->rc,in,in_pos,dict._40_8_);
  if (!_Var6) {
    return LZMA_OK;
  }
  rc.range = (coder->rc).init_bytes_left;
  rc_in_pos._0_4_ = (coder->rc).range;
  rc_in_pos._4_4_ = (coder->rc).code;
  _state = *in_pos;
  switch(coder->sequence) {
  case SEQ_INDICATOR:
  case SEQ_BLOCK_HEADER:
    while (!bVar14 || dict.buf != (uint8_t *)dict.full) {
      if ((uint)rc_in_pos < 0x1000000) {
        if (_state == dict._40_8_) {
          coder->sequence = SEQ_BLOCK_HEADER;
          goto LAB_00ad3ce0;
        }
        rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
        _state = _state + 1;
      }
      rep0 = ((uint)rc_in_pos >> 0xb) * (uint)coder->is_match[rep1][uStack_cc];
      if (rc_in_pos._4_4_ < rep0) {
        rc_in_pos = CONCAT44(rc_in_pos._4_4_,rep0);
        coder->is_match[rep1][uStack_cc] =
             coder->is_match[rep1][uStack_cc] +
             (short)(0x800 - coder->is_match[rep1][uStack_cc] >> 5);
        uVar11 = (ulong)dict.buf & (ulong)uVar1;
        bVar12 = (byte)uVar2;
        bVar7 = dict_get((lzma_dict *)&dict_start,0);
        _limit = coder->literal +
                 (uVar11 << (bVar12 & 0x3f)) + (long)((int)(uint)bVar7 >> (8 - bVar12 & 0x1f));
        offset = 1;
        if (rep1 < 7) {
switchD_00acd5c5_caseD_2:
          if ((uint)rc_in_pos < 0x1000000) {
            if (_state == dict._40_8_) {
              coder->sequence = SEQ_BLOCK;
              goto LAB_00ad3ce0;
            }
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
            _state = _state + 1;
          }
          uVar8 = ((uint)rc_in_pos >> 0xb) * (uint)(*_limit)[offset];
          if (rc_in_pos._4_4_ < uVar8) {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
            (*_limit)[offset] = (*_limit)[offset] + (short)(0x800 - (*_limit)[offset] >> 5);
            offset = offset << 1;
          }
          else {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
            (*_limit)[offset] = (*_limit)[offset] - (short)((int)(uint)(*_limit)[offset] >> 5);
            offset = offset * 2 + 1;
          }
switchD_00acd5c5_caseD_3:
          if ((uint)rc_in_pos < 0x1000000) {
            if (_state == dict._40_8_) {
              coder->sequence = SEQ_CODER_INIT;
              goto LAB_00ad3ce0;
            }
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
            _state = _state + 1;
          }
          uVar8 = ((uint)rc_in_pos >> 0xb) * (uint)(*_limit)[offset];
          if (rc_in_pos._4_4_ < uVar8) {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
            (*_limit)[offset] = (*_limit)[offset] + (short)(0x800 - (*_limit)[offset] >> 5);
            offset = offset << 1;
          }
          else {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
            (*_limit)[offset] = (*_limit)[offset] - (short)((int)(uint)(*_limit)[offset] >> 5);
            offset = offset * 2 + 1;
          }
switchD_00acd5c5_caseD_4:
          if ((uint)rc_in_pos < 0x1000000) {
            if (_state == dict._40_8_) {
              coder->sequence = SEQ_CODE;
              goto LAB_00ad3ce0;
            }
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
            _state = _state + 1;
          }
          uVar8 = ((uint)rc_in_pos >> 0xb) * (uint)(*_limit)[offset];
          if (rc_in_pos._4_4_ < uVar8) {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
            (*_limit)[offset] = (*_limit)[offset] + (short)(0x800 - (*_limit)[offset] >> 5);
            offset = offset << 1;
          }
          else {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
            (*_limit)[offset] = (*_limit)[offset] - (short)((int)(uint)(*_limit)[offset] >> 5);
            offset = offset * 2 + 1;
          }
switchD_00acd5c5_caseD_5:
          if ((uint)rc_in_pos < 0x1000000) {
            if (_state == dict._40_8_) {
              coder->sequence = SEQ_LITERAL3;
              goto LAB_00ad3ce0;
            }
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
            _state = _state + 1;
          }
          uVar8 = ((uint)rc_in_pos >> 0xb) * (uint)(*_limit)[offset];
          if (rc_in_pos._4_4_ < uVar8) {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
            (*_limit)[offset] = (*_limit)[offset] + (short)(0x800 - (*_limit)[offset] >> 5);
            offset = offset << 1;
          }
          else {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
            (*_limit)[offset] = (*_limit)[offset] - (short)((int)(uint)(*_limit)[offset] >> 5);
            offset = offset * 2 + 1;
          }
switchD_00acd5c5_caseD_6:
          if ((uint)rc_in_pos < 0x1000000) {
            if (_state == dict._40_8_) {
              coder->sequence = SEQ_CRC32;
              goto LAB_00ad3ce0;
            }
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
            _state = _state + 1;
          }
          uVar8 = ((uint)rc_in_pos >> 0xb) * (uint)(*_limit)[offset];
          if (rc_in_pos._4_4_ < uVar8) {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
            (*_limit)[offset] = (*_limit)[offset] + (short)(0x800 - (*_limit)[offset] >> 5);
            offset = offset << 1;
          }
          else {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
            (*_limit)[offset] = (*_limit)[offset] - (short)((int)(uint)(*_limit)[offset] >> 5);
            offset = offset * 2 + 1;
          }
switchD_00acd5c5_caseD_7:
          if ((uint)rc_in_pos < 0x1000000) {
            if (_state == dict._40_8_) {
              coder->sequence = SEQ_LITERAL5;
              goto LAB_00ad3ce0;
            }
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
            _state = _state + 1;
          }
          uVar8 = ((uint)rc_in_pos >> 0xb) * (uint)(*_limit)[offset];
          if (rc_in_pos._4_4_ < uVar8) {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
            (*_limit)[offset] = (*_limit)[offset] + (short)(0x800 - (*_limit)[offset] >> 5);
            offset = offset << 1;
          }
          else {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
            (*_limit)[offset] = (*_limit)[offset] - (short)((int)(uint)(*_limit)[offset] >> 5);
            offset = offset * 2 + 1;
          }
switchD_00acd5c5_caseD_8:
          if ((uint)rc_in_pos < 0x1000000) {
            if (_state == dict._40_8_) {
              coder->sequence = SEQ_LITERAL6;
              goto LAB_00ad3ce0;
            }
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
            _state = _state + 1;
          }
          uVar8 = ((uint)rc_in_pos >> 0xb) * (uint)(*_limit)[offset];
          if (rc_in_pos._4_4_ < uVar8) {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
            (*_limit)[offset] = (*_limit)[offset] + (short)(0x800 - (*_limit)[offset] >> 5);
            offset = offset << 1;
          }
          else {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
            (*_limit)[offset] = (*_limit)[offset] - (short)((int)(uint)(*_limit)[offset] >> 5);
            offset = offset * 2 + 1;
          }
switchD_00acd5c5_caseD_9:
          if ((uint)rc_in_pos < 0x1000000) {
            if (_state == dict._40_8_) {
              coder->sequence = SEQ_LITERAL7;
              goto LAB_00ad3ce0;
            }
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
            _state = _state + 1;
          }
          rep0 = ((uint)rc_in_pos >> 0xb) * (uint)(*_limit)[offset];
          if (rc_in_pos._4_4_ < rep0) {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_,rep0);
            (*_limit)[offset] = (*_limit)[offset] + (short)(0x800 - (*_limit)[offset] >> 5);
            offset = offset << 1;
          }
          else {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ - rep0,(uint)rc_in_pos - rep0);
            (*_limit)[offset] = (*_limit)[offset] - (short)((int)(uint)(*_limit)[offset] >> 5);
            offset = offset * 2 + 1;
          }
        }
        else {
          bVar7 = dict_get((lzma_dict *)&dict_start,rep2);
          literal_context_bits = (uint)bVar7 << 1;
          literal_pos_mask = 0x100;
switchD_00acd5c5_caseD_a:
          uVar9 = literal_context_bits & literal_pos_mask;
          uVar8 = literal_pos_mask + uVar9 + offset;
          if ((uint)rc_in_pos < 0x1000000) {
            if (_state == dict._40_8_) {
              coder->sequence = SEQ_LITERAL_MATCHED0;
              goto LAB_00ad3ce0;
            }
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
            _state = _state + 1;
          }
          uVar10 = ((uint)rc_in_pos >> 0xb) * (uint)(*_limit)[uVar8];
          if (rc_in_pos._4_4_ < uVar10) {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar10);
            (*_limit)[uVar8] = (*_limit)[uVar8] + (short)(0x800 - (*_limit)[uVar8] >> 5);
            offset = offset << 1;
            uVar9 = uVar9 ^ 0xffffffff;
          }
          else {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar10,(uint)rc_in_pos - uVar10);
            (*_limit)[uVar8] = (*_limit)[uVar8] - (short)((int)(uint)(*_limit)[uVar8] >> 5);
            offset = offset * 2 + 1;
          }
          literal_pos_mask = uVar9 & literal_pos_mask;
          literal_context_bits = literal_context_bits << 1;
switchD_00acd5c5_caseD_b:
          uVar9 = literal_context_bits & literal_pos_mask;
          uVar8 = literal_pos_mask + uVar9 + offset;
          if ((uint)rc_in_pos < 0x1000000) {
            if (_state == dict._40_8_) {
              coder->sequence = SEQ_LITERAL_MATCHED1;
              goto LAB_00ad3ce0;
            }
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
            _state = _state + 1;
          }
          uVar10 = ((uint)rc_in_pos >> 0xb) * (uint)(*_limit)[uVar8];
          if (rc_in_pos._4_4_ < uVar10) {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar10);
            (*_limit)[uVar8] = (*_limit)[uVar8] + (short)(0x800 - (*_limit)[uVar8] >> 5);
            offset = offset << 1;
            uVar9 = uVar9 ^ 0xffffffff;
          }
          else {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar10,(uint)rc_in_pos - uVar10);
            (*_limit)[uVar8] = (*_limit)[uVar8] - (short)((int)(uint)(*_limit)[uVar8] >> 5);
            offset = offset * 2 + 1;
          }
          literal_pos_mask = uVar9 & literal_pos_mask;
          literal_context_bits = literal_context_bits << 1;
switchD_00acd5c5_caseD_c:
          uVar9 = literal_context_bits & literal_pos_mask;
          uVar8 = literal_pos_mask + uVar9 + offset;
          if ((uint)rc_in_pos < 0x1000000) {
            if (_state == dict._40_8_) {
              coder->sequence = SEQ_LITERAL_MATCHED2;
              goto LAB_00ad3ce0;
            }
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
            _state = _state + 1;
          }
          uVar10 = ((uint)rc_in_pos >> 0xb) * (uint)(*_limit)[uVar8];
          if (rc_in_pos._4_4_ < uVar10) {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar10);
            (*_limit)[uVar8] = (*_limit)[uVar8] + (short)(0x800 - (*_limit)[uVar8] >> 5);
            offset = offset << 1;
            uVar9 = uVar9 ^ 0xffffffff;
          }
          else {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar10,(uint)rc_in_pos - uVar10);
            (*_limit)[uVar8] = (*_limit)[uVar8] - (short)((int)(uint)(*_limit)[uVar8] >> 5);
            offset = offset * 2 + 1;
          }
          literal_pos_mask = uVar9 & literal_pos_mask;
          literal_context_bits = literal_context_bits << 1;
switchD_00acd5c5_caseD_d:
          uVar9 = literal_context_bits & literal_pos_mask;
          uVar8 = literal_pos_mask + uVar9 + offset;
          if ((uint)rc_in_pos < 0x1000000) {
            if (_state == dict._40_8_) {
              coder->sequence = SEQ_LITERAL_MATCHED3;
              goto LAB_00ad3ce0;
            }
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
            _state = _state + 1;
          }
          uVar10 = ((uint)rc_in_pos >> 0xb) * (uint)(*_limit)[uVar8];
          if (rc_in_pos._4_4_ < uVar10) {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar10);
            (*_limit)[uVar8] = (*_limit)[uVar8] + (short)(0x800 - (*_limit)[uVar8] >> 5);
            offset = offset << 1;
            uVar9 = uVar9 ^ 0xffffffff;
          }
          else {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar10,(uint)rc_in_pos - uVar10);
            (*_limit)[uVar8] = (*_limit)[uVar8] - (short)((int)(uint)(*_limit)[uVar8] >> 5);
            offset = offset * 2 + 1;
          }
          literal_pos_mask = uVar9 & literal_pos_mask;
          literal_context_bits = literal_context_bits << 1;
switchD_00acd5c5_caseD_e:
          uVar9 = literal_context_bits & literal_pos_mask;
          uVar8 = literal_pos_mask + uVar9 + offset;
          if ((uint)rc_in_pos < 0x1000000) {
            if (_state == dict._40_8_) {
              coder->sequence = SEQ_LITERAL_MATCHED4;
              goto LAB_00ad3ce0;
            }
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
            _state = _state + 1;
          }
          uVar10 = ((uint)rc_in_pos >> 0xb) * (uint)(*_limit)[uVar8];
          if (rc_in_pos._4_4_ < uVar10) {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar10);
            (*_limit)[uVar8] = (*_limit)[uVar8] + (short)(0x800 - (*_limit)[uVar8] >> 5);
            offset = offset << 1;
            uVar9 = uVar9 ^ 0xffffffff;
          }
          else {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar10,(uint)rc_in_pos - uVar10);
            (*_limit)[uVar8] = (*_limit)[uVar8] - (short)((int)(uint)(*_limit)[uVar8] >> 5);
            offset = offset * 2 + 1;
          }
          literal_pos_mask = uVar9 & literal_pos_mask;
          literal_context_bits = literal_context_bits << 1;
switchD_00acd5c5_caseD_f:
          uVar9 = literal_context_bits & literal_pos_mask;
          uVar8 = literal_pos_mask + uVar9 + offset;
          if ((uint)rc_in_pos < 0x1000000) {
            if (_state == dict._40_8_) {
              coder->sequence = SEQ_LITERAL_MATCHED5;
              goto LAB_00ad3ce0;
            }
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
            _state = _state + 1;
          }
          uVar10 = ((uint)rc_in_pos >> 0xb) * (uint)(*_limit)[uVar8];
          if (rc_in_pos._4_4_ < uVar10) {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar10);
            (*_limit)[uVar8] = (*_limit)[uVar8] + (short)(0x800 - (*_limit)[uVar8] >> 5);
            offset = offset << 1;
            uVar9 = uVar9 ^ 0xffffffff;
          }
          else {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar10,(uint)rc_in_pos - uVar10);
            (*_limit)[uVar8] = (*_limit)[uVar8] - (short)((int)(uint)(*_limit)[uVar8] >> 5);
            offset = offset * 2 + 1;
          }
          literal_pos_mask = uVar9 & literal_pos_mask;
          literal_context_bits = literal_context_bits << 1;
switchD_00acd5c5_caseD_10:
          uVar9 = literal_context_bits & literal_pos_mask;
          uVar8 = literal_pos_mask + uVar9 + offset;
          if ((uint)rc_in_pos < 0x1000000) {
            if (_state == dict._40_8_) {
              coder->sequence = SEQ_LITERAL_MATCHED6;
              goto LAB_00ad3ce0;
            }
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
            _state = _state + 1;
          }
          uVar10 = ((uint)rc_in_pos >> 0xb) * (uint)(*_limit)[uVar8];
          if (rc_in_pos._4_4_ < uVar10) {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar10);
            (*_limit)[uVar8] = (*_limit)[uVar8] + (short)(0x800 - (*_limit)[uVar8] >> 5);
            offset = offset << 1;
            uVar9 = uVar9 ^ 0xffffffff;
          }
          else {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar10,(uint)rc_in_pos - uVar10);
            (*_limit)[uVar8] = (*_limit)[uVar8] - (short)((int)(uint)(*_limit)[uVar8] >> 5);
            offset = offset * 2 + 1;
          }
          literal_pos_mask = uVar9 & literal_pos_mask;
          literal_context_bits = literal_context_bits << 1;
switchD_00acd5c5_caseD_11:
          uVar9 = literal_context_bits & literal_pos_mask;
          uVar8 = literal_pos_mask + uVar9 + offset;
          if ((uint)rc_in_pos < 0x1000000) {
            if (_state == dict._40_8_) {
              coder->sequence = SEQ_LITERAL_MATCHED7;
              goto LAB_00ad3ce0;
            }
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
            _state = _state + 1;
          }
          rep0 = ((uint)rc_in_pos >> 0xb) * (uint)(*_limit)[uVar8];
          if (rc_in_pos._4_4_ < rep0) {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_,rep0);
            (*_limit)[uVar8] = (*_limit)[uVar8] + (short)(0x800 - (*_limit)[uVar8] >> 5);
            offset = offset << 1;
            uVar9 = uVar9 ^ 0xffffffff;
          }
          else {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ - rep0,(uint)rc_in_pos - rep0);
            (*_limit)[uVar8] = (*_limit)[uVar8] - (short)((int)(uint)(*_limit)[uVar8] >> 5);
            offset = offset * 2 + 1;
          }
          literal_pos_mask = uVar9 & literal_pos_mask;
        }
        rep1 = lzma_decode::next_state[rep1];
switchD_00acd5c5_caseD_12:
        _Var6 = dict_put((lzma_dict *)&dict_start,(uint8_t)offset);
        if (_Var6) {
          coder->sequence = SEQ_LITERAL_WRITE;
          goto LAB_00ad3ce0;
        }
      }
      else {
        rc_in_pos = CONCAT44(rc_in_pos._4_4_ - rep0,(uint)rc_in_pos - rep0);
        coder->is_match[rep1][uStack_cc] =
             coder->is_match[rep1][uStack_cc] -
             (short)((int)(uint)coder->is_match[rep1][uStack_cc] >> 5);
switchD_00acd5c5_caseD_13:
        if ((uint)rc_in_pos < 0x1000000) {
          if (_state == dict._40_8_) {
            coder->sequence = SEQ_IS_REP;
            goto LAB_00ad3ce0;
          }
          rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
          _state = _state + 1;
        }
        rep0 = ((uint)rc_in_pos >> 0xb) * (uint)coder->is_rep[rep1];
        if (rc_in_pos._4_4_ < rep0) {
          rc_in_pos = CONCAT44(rc_in_pos._4_4_,rep0);
          coder->is_rep[rep1] = coder->is_rep[rep1] + (short)(0x800 - coder->is_rep[rep1] >> 5);
          bVar13 = rep1 < 7;
          rep1 = 10;
          if (bVar13) {
            rep1 = 7;
          }
          local_a0 = pos_mask;
          pos_mask = rep3;
          rep3 = rep2;
          offset = 1;
switchD_00acd5c5_caseD_14:
          if ((uint)rc_in_pos < 0x1000000) {
            if (_state == dict._40_8_) {
              coder->sequence = SEQ_MATCH_LEN_CHOICE;
              goto LAB_00ad3ce0;
            }
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
            _state = _state + 1;
          }
          uVar8 = ((uint)rc_in_pos >> 0xb) * (uint)(coder->match_len_decoder).choice;
          if (rc_in_pos._4_4_ < uVar8) {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
            (coder->match_len_decoder).choice =
                 (coder->match_len_decoder).choice +
                 (short)(0x800 - (coder->match_len_decoder).choice >> 5);
switchD_00acd5c5_caseD_15:
            if ((uint)rc_in_pos < 0x1000000) {
              if (_state == dict._40_8_) {
                coder->sequence = SEQ_MATCH_LEN_LOW0;
                goto LAB_00ad3ce0;
              }
              rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
              _state = _state + 1;
            }
            uVar8 = ((uint)rc_in_pos >> 0xb) *
                    (uint)(coder->match_len_decoder).low[uStack_cc][offset];
            if (rc_in_pos._4_4_ < uVar8) {
              rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
              (coder->match_len_decoder).low[uStack_cc][offset] =
                   (coder->match_len_decoder).low[uStack_cc][offset] +
                   (short)(0x800 - (coder->match_len_decoder).low[uStack_cc][offset] >> 5);
              offset = offset << 1;
            }
            else {
              rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
              (coder->match_len_decoder).low[uStack_cc][offset] =
                   (coder->match_len_decoder).low[uStack_cc][offset] -
                   (short)((int)(uint)(coder->match_len_decoder).low[uStack_cc][offset] >> 5);
              offset = offset * 2 + 1;
            }
switchD_00acd5c5_caseD_16:
            if ((uint)rc_in_pos < 0x1000000) {
              if (_state == dict._40_8_) {
                coder->sequence = SEQ_MATCH_LEN_LOW1;
                goto LAB_00ad3ce0;
              }
              rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
              _state = _state + 1;
            }
            uVar8 = ((uint)rc_in_pos >> 0xb) *
                    (uint)(coder->match_len_decoder).low[uStack_cc][offset];
            if (rc_in_pos._4_4_ < uVar8) {
              rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
              (coder->match_len_decoder).low[uStack_cc][offset] =
                   (coder->match_len_decoder).low[uStack_cc][offset] +
                   (short)(0x800 - (coder->match_len_decoder).low[uStack_cc][offset] >> 5);
              offset = offset << 1;
            }
            else {
              rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
              (coder->match_len_decoder).low[uStack_cc][offset] =
                   (coder->match_len_decoder).low[uStack_cc][offset] -
                   (short)((int)(uint)(coder->match_len_decoder).low[uStack_cc][offset] >> 5);
              offset = offset * 2 + 1;
            }
switchD_00acd5c5_caseD_17:
            if ((uint)rc_in_pos < 0x1000000) {
              if (_state == dict._40_8_) {
                coder->sequence = SEQ_MATCH_LEN_LOW2;
                goto LAB_00ad3ce0;
              }
              rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
              _state = _state + 1;
            }
            uVar8 = ((uint)rc_in_pos >> 0xb) *
                    (uint)(coder->match_len_decoder).low[uStack_cc][offset];
            if (rc_in_pos._4_4_ < uVar8) {
              rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
              (coder->match_len_decoder).low[uStack_cc][offset] =
                   (coder->match_len_decoder).low[uStack_cc][offset] +
                   (short)(0x800 - (coder->match_len_decoder).low[uStack_cc][offset] >> 5);
              offset = offset << 1;
            }
            else {
              rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
              (coder->match_len_decoder).low[uStack_cc][offset] =
                   (coder->match_len_decoder).low[uStack_cc][offset] -
                   (short)((int)(uint)(coder->match_len_decoder).low[uStack_cc][offset] >> 5);
              offset = offset * 2 + 1;
            }
            literal_context_bits = offset - 6;
          }
          else {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
            (coder->match_len_decoder).choice =
                 (coder->match_len_decoder).choice -
                 (short)((int)(uint)(coder->match_len_decoder).choice >> 5);
switchD_00acd5c5_caseD_18:
            if ((uint)rc_in_pos < 0x1000000) {
              if (_state == dict._40_8_) {
                coder->sequence = SEQ_MATCH_LEN_CHOICE2;
                goto LAB_00ad3ce0;
              }
              rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
              _state = _state + 1;
            }
            uVar8 = ((uint)rc_in_pos >> 0xb) * (uint)(coder->match_len_decoder).choice2;
            if (rc_in_pos._4_4_ < uVar8) {
              rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
              (coder->match_len_decoder).choice2 =
                   (coder->match_len_decoder).choice2 +
                   (short)(0x800 - (coder->match_len_decoder).choice2 >> 5);
switchD_00acd5c5_caseD_19:
              if ((uint)rc_in_pos < 0x1000000) {
                if (_state == dict._40_8_) {
                  coder->sequence = SEQ_MATCH_LEN_MID0;
                  goto LAB_00ad3ce0;
                }
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
                _state = _state + 1;
              }
              uVar8 = ((uint)rc_in_pos >> 0xb) *
                      (uint)(coder->match_len_decoder).mid[uStack_cc][offset];
              if (rc_in_pos._4_4_ < uVar8) {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
                (coder->match_len_decoder).mid[uStack_cc][offset] =
                     (coder->match_len_decoder).mid[uStack_cc][offset] +
                     (short)(0x800 - (coder->match_len_decoder).mid[uStack_cc][offset] >> 5);
                offset = offset << 1;
              }
              else {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
                (coder->match_len_decoder).mid[uStack_cc][offset] =
                     (coder->match_len_decoder).mid[uStack_cc][offset] -
                     (short)((int)(uint)(coder->match_len_decoder).mid[uStack_cc][offset] >> 5);
                offset = offset * 2 + 1;
              }
switchD_00acd5c5_caseD_1a:
              if ((uint)rc_in_pos < 0x1000000) {
                if (_state == dict._40_8_) {
                  coder->sequence = SEQ_MATCH_LEN_MID1;
                  goto LAB_00ad3ce0;
                }
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
                _state = _state + 1;
              }
              uVar8 = ((uint)rc_in_pos >> 0xb) *
                      (uint)(coder->match_len_decoder).mid[uStack_cc][offset];
              if (rc_in_pos._4_4_ < uVar8) {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
                (coder->match_len_decoder).mid[uStack_cc][offset] =
                     (coder->match_len_decoder).mid[uStack_cc][offset] +
                     (short)(0x800 - (coder->match_len_decoder).mid[uStack_cc][offset] >> 5);
                offset = offset << 1;
              }
              else {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
                (coder->match_len_decoder).mid[uStack_cc][offset] =
                     (coder->match_len_decoder).mid[uStack_cc][offset] -
                     (short)((int)(uint)(coder->match_len_decoder).mid[uStack_cc][offset] >> 5);
                offset = offset * 2 + 1;
              }
switchD_00acd5c5_caseD_1b:
              if ((uint)rc_in_pos < 0x1000000) {
                if (_state == dict._40_8_) {
                  coder->sequence = SEQ_MATCH_LEN_MID2;
                  goto LAB_00ad3ce0;
                }
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
                _state = _state + 1;
              }
              uVar8 = ((uint)rc_in_pos >> 0xb) *
                      (uint)(coder->match_len_decoder).mid[uStack_cc][offset];
              if (rc_in_pos._4_4_ < uVar8) {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
                (coder->match_len_decoder).mid[uStack_cc][offset] =
                     (coder->match_len_decoder).mid[uStack_cc][offset] +
                     (short)(0x800 - (coder->match_len_decoder).mid[uStack_cc][offset] >> 5);
                offset = offset << 1;
              }
              else {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
                (coder->match_len_decoder).mid[uStack_cc][offset] =
                     (coder->match_len_decoder).mid[uStack_cc][offset] -
                     (short)((int)(uint)(coder->match_len_decoder).mid[uStack_cc][offset] >> 5);
                offset = offset * 2 + 1;
              }
              literal_context_bits = offset + 2;
            }
            else {
              rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
              (coder->match_len_decoder).choice2 =
                   (coder->match_len_decoder).choice2 -
                   (short)((int)(uint)(coder->match_len_decoder).choice2 >> 5);
switchD_00acd5c5_caseD_1c:
              if ((uint)rc_in_pos < 0x1000000) {
                if (_state == dict._40_8_) {
                  coder->sequence = SEQ_MATCH_LEN_HIGH0;
                  goto LAB_00ad3ce0;
                }
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
                _state = _state + 1;
              }
              uVar8 = ((uint)rc_in_pos >> 0xb) * (uint)(coder->match_len_decoder).high[offset];
              if (rc_in_pos._4_4_ < uVar8) {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
                (coder->match_len_decoder).high[offset] =
                     (coder->match_len_decoder).high[offset] +
                     (short)(0x800 - (coder->match_len_decoder).high[offset] >> 5);
                offset = offset << 1;
              }
              else {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
                (coder->match_len_decoder).high[offset] =
                     (coder->match_len_decoder).high[offset] -
                     (short)((int)(uint)(coder->match_len_decoder).high[offset] >> 5);
                offset = offset * 2 + 1;
              }
switchD_00acd5c5_caseD_1d:
              if ((uint)rc_in_pos < 0x1000000) {
                if (_state == dict._40_8_) {
                  coder->sequence = SEQ_MATCH_LEN_HIGH1;
                  goto LAB_00ad3ce0;
                }
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
                _state = _state + 1;
              }
              uVar8 = ((uint)rc_in_pos >> 0xb) * (uint)(coder->match_len_decoder).high[offset];
              if (rc_in_pos._4_4_ < uVar8) {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
                (coder->match_len_decoder).high[offset] =
                     (coder->match_len_decoder).high[offset] +
                     (short)(0x800 - (coder->match_len_decoder).high[offset] >> 5);
                offset = offset << 1;
              }
              else {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
                (coder->match_len_decoder).high[offset] =
                     (coder->match_len_decoder).high[offset] -
                     (short)((int)(uint)(coder->match_len_decoder).high[offset] >> 5);
                offset = offset * 2 + 1;
              }
switchD_00acd5c5_caseD_1e:
              if ((uint)rc_in_pos < 0x1000000) {
                if (_state == dict._40_8_) {
                  coder->sequence = SEQ_MATCH_LEN_HIGH2;
                  goto LAB_00ad3ce0;
                }
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
                _state = _state + 1;
              }
              uVar8 = ((uint)rc_in_pos >> 0xb) * (uint)(coder->match_len_decoder).high[offset];
              if (rc_in_pos._4_4_ < uVar8) {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
                (coder->match_len_decoder).high[offset] =
                     (coder->match_len_decoder).high[offset] +
                     (short)(0x800 - (coder->match_len_decoder).high[offset] >> 5);
                offset = offset << 1;
              }
              else {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
                (coder->match_len_decoder).high[offset] =
                     (coder->match_len_decoder).high[offset] -
                     (short)((int)(uint)(coder->match_len_decoder).high[offset] >> 5);
                offset = offset * 2 + 1;
              }
switchD_00acd5c5_caseD_1f:
              if ((uint)rc_in_pos < 0x1000000) {
                if (_state == dict._40_8_) {
                  coder->sequence = SEQ_MATCH_LEN_HIGH3;
                  goto LAB_00ad3ce0;
                }
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
                _state = _state + 1;
              }
              uVar8 = ((uint)rc_in_pos >> 0xb) * (uint)(coder->match_len_decoder).high[offset];
              if (rc_in_pos._4_4_ < uVar8) {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
                (coder->match_len_decoder).high[offset] =
                     (coder->match_len_decoder).high[offset] +
                     (short)(0x800 - (coder->match_len_decoder).high[offset] >> 5);
                offset = offset << 1;
              }
              else {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
                (coder->match_len_decoder).high[offset] =
                     (coder->match_len_decoder).high[offset] -
                     (short)((int)(uint)(coder->match_len_decoder).high[offset] >> 5);
                offset = offset * 2 + 1;
              }
switchD_00acd5c5_caseD_20:
              if ((uint)rc_in_pos < 0x1000000) {
                if (_state == dict._40_8_) {
                  coder->sequence = SEQ_MATCH_LEN_HIGH4;
                  goto LAB_00ad3ce0;
                }
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
                _state = _state + 1;
              }
              uVar8 = ((uint)rc_in_pos >> 0xb) * (uint)(coder->match_len_decoder).high[offset];
              if (rc_in_pos._4_4_ < uVar8) {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
                (coder->match_len_decoder).high[offset] =
                     (coder->match_len_decoder).high[offset] +
                     (short)(0x800 - (coder->match_len_decoder).high[offset] >> 5);
                offset = offset << 1;
              }
              else {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
                (coder->match_len_decoder).high[offset] =
                     (coder->match_len_decoder).high[offset] -
                     (short)((int)(uint)(coder->match_len_decoder).high[offset] >> 5);
                offset = offset * 2 + 1;
              }
switchD_00acd5c5_caseD_21:
              if ((uint)rc_in_pos < 0x1000000) {
                if (_state == dict._40_8_) {
                  coder->sequence = SEQ_MATCH_LEN_HIGH5;
                  goto LAB_00ad3ce0;
                }
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
                _state = _state + 1;
              }
              uVar8 = ((uint)rc_in_pos >> 0xb) * (uint)(coder->match_len_decoder).high[offset];
              if (rc_in_pos._4_4_ < uVar8) {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
                (coder->match_len_decoder).high[offset] =
                     (coder->match_len_decoder).high[offset] +
                     (short)(0x800 - (coder->match_len_decoder).high[offset] >> 5);
                offset = offset << 1;
              }
              else {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
                (coder->match_len_decoder).high[offset] =
                     (coder->match_len_decoder).high[offset] -
                     (short)((int)(uint)(coder->match_len_decoder).high[offset] >> 5);
                offset = offset * 2 + 1;
              }
switchD_00acd5c5_caseD_22:
              if ((uint)rc_in_pos < 0x1000000) {
                if (_state == dict._40_8_) {
                  coder->sequence = SEQ_MATCH_LEN_HIGH6;
                  goto LAB_00ad3ce0;
                }
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
                _state = _state + 1;
              }
              uVar8 = ((uint)rc_in_pos >> 0xb) * (uint)(coder->match_len_decoder).high[offset];
              if (rc_in_pos._4_4_ < uVar8) {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
                (coder->match_len_decoder).high[offset] =
                     (coder->match_len_decoder).high[offset] +
                     (short)(0x800 - (coder->match_len_decoder).high[offset] >> 5);
                offset = offset << 1;
              }
              else {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
                (coder->match_len_decoder).high[offset] =
                     (coder->match_len_decoder).high[offset] -
                     (short)((int)(uint)(coder->match_len_decoder).high[offset] >> 5);
                offset = offset * 2 + 1;
              }
switchD_00acd5c5_caseD_23:
              if ((uint)rc_in_pos < 0x1000000) {
                if (_state == dict._40_8_) {
                  coder->sequence = SEQ_MATCH_LEN_HIGH7;
                  goto LAB_00ad3ce0;
                }
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
                _state = _state + 1;
              }
              uVar8 = ((uint)rc_in_pos >> 0xb) * (uint)(coder->match_len_decoder).high[offset];
              if (rc_in_pos._4_4_ < uVar8) {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
                (coder->match_len_decoder).high[offset] =
                     (coder->match_len_decoder).high[offset] +
                     (short)(0x800 - (coder->match_len_decoder).high[offset] >> 5);
                offset = offset << 1;
              }
              else {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
                (coder->match_len_decoder).high[offset] =
                     (coder->match_len_decoder).high[offset] -
                     (short)((int)(uint)(coder->match_len_decoder).high[offset] >> 5);
                offset = offset * 2 + 1;
              }
              literal_context_bits = offset - 0xee;
            }
          }
          if (literal_context_bits < 6) {
            local_114 = literal_context_bits - 2;
          }
          else {
            local_114 = 3;
          }
          _limit = (probability (*) [768])(coder->pos_slot + local_114);
          offset = 1;
switchD_00acd5c5_caseD_24:
          if ((uint)rc_in_pos < 0x1000000) {
            if (_state == dict._40_8_) {
              coder->sequence = SEQ_POS_SLOT0;
              goto LAB_00ad3ce0;
            }
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
            _state = _state + 1;
          }
          uVar8 = ((uint)rc_in_pos >> 0xb) * (uint)(*_limit)[offset];
          if (rc_in_pos._4_4_ < uVar8) {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
            (*_limit)[offset] = (*_limit)[offset] + (short)(0x800 - (*_limit)[offset] >> 5);
            offset = offset << 1;
          }
          else {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
            (*_limit)[offset] = (*_limit)[offset] - (short)((int)(uint)(*_limit)[offset] >> 5);
            offset = offset * 2 + 1;
          }
switchD_00acd5c5_caseD_25:
          if ((uint)rc_in_pos < 0x1000000) {
            if (_state == dict._40_8_) {
              coder->sequence = SEQ_POS_SLOT1;
              goto LAB_00ad3ce0;
            }
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
            _state = _state + 1;
          }
          uVar8 = ((uint)rc_in_pos >> 0xb) * (uint)(*_limit)[offset];
          if (rc_in_pos._4_4_ < uVar8) {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
            (*_limit)[offset] = (*_limit)[offset] + (short)(0x800 - (*_limit)[offset] >> 5);
            offset = offset << 1;
          }
          else {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
            (*_limit)[offset] = (*_limit)[offset] - (short)((int)(uint)(*_limit)[offset] >> 5);
            offset = offset * 2 + 1;
          }
switchD_00acd5c5_caseD_26:
          if ((uint)rc_in_pos < 0x1000000) {
            if (_state == dict._40_8_) {
              coder->sequence = SEQ_POS_SLOT2;
              goto LAB_00ad3ce0;
            }
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
            _state = _state + 1;
          }
          uVar8 = ((uint)rc_in_pos >> 0xb) * (uint)(*_limit)[offset];
          if (rc_in_pos._4_4_ < uVar8) {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
            (*_limit)[offset] = (*_limit)[offset] + (short)(0x800 - (*_limit)[offset] >> 5);
            offset = offset << 1;
          }
          else {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
            (*_limit)[offset] = (*_limit)[offset] - (short)((int)(uint)(*_limit)[offset] >> 5);
            offset = offset * 2 + 1;
          }
switchD_00acd5c5_caseD_27:
          if ((uint)rc_in_pos < 0x1000000) {
            if (_state == dict._40_8_) {
              coder->sequence = SEQ_POS_SLOT3;
              goto LAB_00ad3ce0;
            }
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
            _state = _state + 1;
          }
          uVar8 = ((uint)rc_in_pos >> 0xb) * (uint)(*_limit)[offset];
          if (rc_in_pos._4_4_ < uVar8) {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
            (*_limit)[offset] = (*_limit)[offset] + (short)(0x800 - (*_limit)[offset] >> 5);
            offset = offset << 1;
          }
          else {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
            (*_limit)[offset] = (*_limit)[offset] - (short)((int)(uint)(*_limit)[offset] >> 5);
            offset = offset * 2 + 1;
          }
switchD_00acd5c5_caseD_28:
          if ((uint)rc_in_pos < 0x1000000) {
            if (_state == dict._40_8_) {
              coder->sequence = SEQ_POS_SLOT4;
              goto LAB_00ad3ce0;
            }
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
            _state = _state + 1;
          }
          uVar8 = ((uint)rc_in_pos >> 0xb) * (uint)(*_limit)[offset];
          if (rc_in_pos._4_4_ < uVar8) {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
            (*_limit)[offset] = (*_limit)[offset] + (short)(0x800 - (*_limit)[offset] >> 5);
            offset = offset << 1;
          }
          else {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
            (*_limit)[offset] = (*_limit)[offset] - (short)((int)(uint)(*_limit)[offset] >> 5);
            offset = offset * 2 + 1;
          }
switchD_00acd5c5_caseD_29:
          if ((uint)rc_in_pos < 0x1000000) {
            if (_state == dict._40_8_) {
              coder->sequence = SEQ_POS_SLOT5;
              goto LAB_00ad3ce0;
            }
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
            _state = _state + 1;
          }
          rep0 = ((uint)rc_in_pos >> 0xb) * (uint)(*_limit)[offset];
          if (rc_in_pos._4_4_ < rep0) {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_,rep0);
            (*_limit)[offset] = (*_limit)[offset] + (short)(0x800 - (*_limit)[offset] >> 5);
            offset = offset << 1;
          }
          else {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ - rep0,(uint)rc_in_pos - rep0);
            (*_limit)[offset] = (*_limit)[offset] - (short)((int)(uint)(*_limit)[offset] >> 5);
            offset = offset * 2 + 1;
          }
          offset = offset - 0x40;
          if (0x3f < offset) {
            __assert_fail("symbol <= 63",
                          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                          ,0x213,
                          "lzma_ret lzma_decode(lzma_coder *restrict, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                         );
          }
          uVar5 = offset;
          if (3 < offset) {
            len = (offset >> 1) - 1;
            if ((len == 0) || (0x1e < len)) {
              __assert_fail("limit >= 1 && limit <= 30",
                            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                            ,0x21c,
                            "lzma_ret lzma_decode(lzma_coder *restrict, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                           );
            }
            rep2 = (offset & 1) + 2;
            if (0xd < offset) {
              if (offset < 0xe) {
                __assert_fail("symbol >= 14",
                              "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                              ,0x265,
                              "lzma_ret lzma_decode(lzma_coder *restrict, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                             );
              }
              if (len < 6) {
                __assert_fail("limit >= 6",
                              "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                              ,0x266,
                              "lzma_ret lzma_decode(lzma_coder *restrict, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                             );
              }
              len = (offset >> 1) - 5;
              if (len < 2) {
                __assert_fail("limit >= 2",
                              "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                              ,0x268,
                              "lzma_ret lzma_decode(lzma_coder *restrict, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                             );
              }
switchD_00acd5c5_caseD_2b:
              do {
                if ((uint)rc_in_pos < 0x1000000) {
                  if (_state == dict._40_8_) {
                    coder->sequence = SEQ_DIRECT;
                    goto LAB_00ad3ce0;
                  }
                  rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8)
                  ;
                  _state = _state + 1;
                }
                uVar9 = (uint)rc_in_pos >> 1;
                uVar8 = (int)(rc_in_pos._4_4_ - uVar9) >> 0x1f;
                rc_in_pos = CONCAT44((uVar9 & uVar8) + (rc_in_pos._4_4_ - uVar9),uVar9);
                rep2 = rep2 * 2 + uVar8 + 1;
                len = len - 1;
              } while (len != 0);
              rep2 = rep2 * 0x10;
              offset = 1;
switchD_00acd5c5_caseD_2c:
              if ((uint)rc_in_pos < 0x1000000) {
                if (_state == dict._40_8_) {
                  coder->sequence = SEQ_ALIGN0;
                  goto LAB_00ad3ce0;
                }
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
                _state = _state + 1;
              }
              uVar8 = ((uint)rc_in_pos >> 0xb) * (uint)coder->pos_align[offset];
              if (rc_in_pos._4_4_ < uVar8) {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
                coder->pos_align[offset] =
                     coder->pos_align[offset] + (short)(0x800 - coder->pos_align[offset] >> 5);
                offset = offset << 1;
              }
              else {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
                coder->pos_align[offset] =
                     coder->pos_align[offset] - (short)((int)(uint)coder->pos_align[offset] >> 5);
                offset = offset * 2 + 1;
                rep2 = rep2 + 1;
              }
switchD_00acd5c5_caseD_2d:
              if ((uint)rc_in_pos < 0x1000000) {
                if (_state == dict._40_8_) {
                  coder->sequence = SEQ_ALIGN1;
                  goto LAB_00ad3ce0;
                }
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
                _state = _state + 1;
              }
              uVar8 = ((uint)rc_in_pos >> 0xb) * (uint)coder->pos_align[offset];
              if (rc_in_pos._4_4_ < uVar8) {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
                coder->pos_align[offset] =
                     coder->pos_align[offset] + (short)(0x800 - coder->pos_align[offset] >> 5);
                offset = offset << 1;
              }
              else {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
                coder->pos_align[offset] =
                     coder->pos_align[offset] - (short)((int)(uint)coder->pos_align[offset] >> 5);
                offset = offset * 2 + 1;
                rep2 = rep2 + 2;
              }
switchD_00acd5c5_caseD_2e:
              if ((uint)rc_in_pos < 0x1000000) {
                if (_state == dict._40_8_) {
                  coder->sequence = SEQ_ALIGN2;
                  goto LAB_00ad3ce0;
                }
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
                _state = _state + 1;
              }
              uVar8 = ((uint)rc_in_pos >> 0xb) * (uint)coder->pos_align[offset];
              if (rc_in_pos._4_4_ < uVar8) {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
                coder->pos_align[offset] =
                     coder->pos_align[offset] + (short)(0x800 - coder->pos_align[offset] >> 5);
                offset = offset << 1;
              }
              else {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
                coder->pos_align[offset] =
                     coder->pos_align[offset] - (short)((int)(uint)coder->pos_align[offset] >> 5);
                offset = offset * 2 + 1;
                rep2 = rep2 + 4;
              }
switchD_00acd5c5_caseD_2f:
              if ((uint)rc_in_pos < 0x1000000) {
                if (_state == dict._40_8_) {
                  coder->sequence = SEQ_ALIGN3;
                  goto LAB_00ad3ce0;
                }
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
                _state = _state + 1;
              }
              rep0 = ((uint)rc_in_pos >> 0xb) * (uint)coder->pos_align[offset];
              if (rc_in_pos._4_4_ < rep0) {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_,rep0);
                coder->pos_align[offset] =
                     coder->pos_align[offset] + (short)(0x800 - coder->pos_align[offset] >> 5);
              }
              else {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ - rep0,(uint)rc_in_pos - rep0);
                coder->pos_align[offset] =
                     coder->pos_align[offset] - (short)((int)(uint)coder->pos_align[offset] >> 5);
                rep2 = rep2 + 8;
              }
              uVar5 = rep2;
              if (rep2 != 0xffffffff) goto switchD_00ad104f_default;
              if (coder->uncompressed_size == 0xffffffffffffffff) goto switchD_00acd5c5_caseD_30;
              match_bit = 9;
              goto LAB_00ad3ce0;
            }
            if (5 < len) {
              __assert_fail("limit <= 5",
                            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                            ,0x222,
                            "lzma_ret lzma_decode(lzma_coder *restrict, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                           );
            }
            rep2 = rep2 << ((byte)len & 0x1f);
            if (0x60 < rep2) {
              __assert_fail("rep0 <= 96",
                            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                            ,0x224,
                            "lzma_ret lzma_decode(lzma_coder *restrict, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                           );
            }
            if ((int)((rep2 - offset) + -1) < -1) {
              __assert_fail("(int32_t)(rep0 - symbol - 1) >= -1",
                            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                            ,0x22c,
                            "lzma_ret lzma_decode(lzma_coder *restrict, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                           );
            }
            if (0x52 < (int)((rep2 - offset) + -1)) {
              __assert_fail("(int32_t)(rep0 - symbol - 1) <= 82",
                            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                            ,0x22e,
                            "lzma_ret lzma_decode(lzma_coder *restrict, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                           );
            }
            _limit = (probability (*) [768])
                     ((long)coder + (ulong)offset * -2 + (ulong)rep2 * 2 + 0x655e);
            offset = 1;
            literal_pos_mask = 0;
switchD_00acd5c5_caseD_2a:
            uVar5 = rep2;
            switch(len) {
            case 1:
              goto switchD_00ad104f_caseD_1;
            case 2:
              goto switchD_00ad104f_caseD_2;
            case 3:
              goto switchD_00ad104f_caseD_3;
            case 4:
              break;
            case 5:
              if (literal_pos_mask != 0) {
                __assert_fail("offset == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                              ,0x23d,
                              "lzma_ret lzma_decode(lzma_coder *restrict, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                             );
              }
              if ((uint)rc_in_pos < 0x1000000) {
                if (_state == dict._40_8_) {
                  coder->sequence = SEQ_POS_MODEL;
                  goto LAB_00ad3ce0;
                }
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
                _state = _state + 1;
              }
              uVar8 = ((uint)rc_in_pos >> 0xb) * (uint)(*_limit)[offset];
              if (rc_in_pos._4_4_ < uVar8) {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
                (*_limit)[offset] = (*_limit)[offset] + (short)(0x800 - (*_limit)[offset] >> 5);
                offset = offset << 1;
              }
              else {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
                (*_limit)[offset] = (*_limit)[offset] - (short)((int)(uint)(*_limit)[offset] >> 5);
                offset = offset * 2 + 1;
                rep2 = rep2 + 1;
              }
              literal_pos_mask = 1;
              len = len - 1;
              break;
            default:
              goto switchD_00ad104f_default;
            }
            if ((uint)rc_in_pos < 0x1000000) {
              if (_state == dict._40_8_) {
                coder->sequence = SEQ_POS_MODEL;
                goto LAB_00ad3ce0;
              }
              rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
              _state = _state + 1;
            }
            uVar8 = ((uint)rc_in_pos >> 0xb) * (uint)(*_limit)[offset];
            if (rc_in_pos._4_4_ < uVar8) {
              rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
              (*_limit)[offset] = (*_limit)[offset] + (short)(0x800 - (*_limit)[offset] >> 5);
              offset = offset << 1;
            }
            else {
              rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
              (*_limit)[offset] = (*_limit)[offset] - (short)((int)(uint)(*_limit)[offset] >> 5);
              offset = offset * 2 + 1;
              rep2 = (1 << ((byte)literal_pos_mask & 0x1f)) + rep2;
            }
            literal_pos_mask = literal_pos_mask + 1;
            len = len - 1;
switchD_00ad104f_caseD_3:
            if ((uint)rc_in_pos < 0x1000000) {
              if (_state == dict._40_8_) {
                coder->sequence = SEQ_POS_MODEL;
                goto LAB_00ad3ce0;
              }
              rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
              _state = _state + 1;
            }
            uVar8 = ((uint)rc_in_pos >> 0xb) * (uint)(*_limit)[offset];
            if (rc_in_pos._4_4_ < uVar8) {
              rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
              (*_limit)[offset] = (*_limit)[offset] + (short)(0x800 - (*_limit)[offset] >> 5);
              offset = offset << 1;
            }
            else {
              rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
              (*_limit)[offset] = (*_limit)[offset] - (short)((int)(uint)(*_limit)[offset] >> 5);
              offset = offset * 2 + 1;
              rep2 = (1 << ((byte)literal_pos_mask & 0x1f)) + rep2;
            }
            literal_pos_mask = literal_pos_mask + 1;
            len = len - 1;
switchD_00ad104f_caseD_2:
            if ((uint)rc_in_pos < 0x1000000) {
              if (_state == dict._40_8_) {
                coder->sequence = SEQ_POS_MODEL;
                goto LAB_00ad3ce0;
              }
              rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
              _state = _state + 1;
            }
            uVar8 = ((uint)rc_in_pos >> 0xb) * (uint)(*_limit)[offset];
            if (rc_in_pos._4_4_ < uVar8) {
              rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
              (*_limit)[offset] = (*_limit)[offset] + (short)(0x800 - (*_limit)[offset] >> 5);
              offset = offset << 1;
            }
            else {
              rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
              (*_limit)[offset] = (*_limit)[offset] - (short)((int)(uint)(*_limit)[offset] >> 5);
              offset = offset * 2 + 1;
              rep2 = (1 << ((byte)literal_pos_mask & 0x1f)) + rep2;
            }
            literal_pos_mask = literal_pos_mask + 1;
            len = len - 1;
switchD_00ad104f_caseD_1:
            if ((uint)rc_in_pos < 0x1000000) {
              if (_state == dict._40_8_) {
                coder->sequence = SEQ_POS_MODEL;
                goto LAB_00ad3ce0;
              }
              rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
              _state = _state + 1;
            }
            rep0 = ((uint)rc_in_pos >> 0xb) * (uint)(*_limit)[offset];
            if (rc_in_pos._4_4_ < rep0) {
              rc_in_pos = CONCAT44(rc_in_pos._4_4_,rep0);
              (*_limit)[offset] = (*_limit)[offset] + (short)(0x800 - (*_limit)[offset] >> 5);
              uVar5 = rep2;
            }
            else {
              rc_in_pos = CONCAT44(rc_in_pos._4_4_ - rep0,(uint)rc_in_pos - rep0);
              (*_limit)[offset] = (*_limit)[offset] - (short)((int)(uint)(*_limit)[offset] >> 5);
              uVar5 = (1 << ((byte)literal_pos_mask & 0x1f)) + rep2;
            }
          }
switchD_00ad104f_default:
          rep2 = uVar5;
          _Var6 = dict_is_distance_valid((lzma_dict *)&dict_start,(ulong)rep2);
          if (((_Var6 ^ 0xffU) & 1) != 0) {
            match_bit = 9;
            goto LAB_00ad3ce0;
          }
        }
        else {
          rc_in_pos = CONCAT44(rc_in_pos._4_4_ - rep0,(uint)rc_in_pos - rep0);
          coder->is_rep[rep1] = coder->is_rep[rep1] - (short)((int)(uint)coder->is_rep[rep1] >> 5);
          _Var6 = dict_is_distance_valid((lzma_dict *)&dict_start,0);
          if (((_Var6 ^ 0xffU) & 1) != 0) {
            match_bit = 9;
            goto LAB_00ad3ce0;
          }
switchD_00acd5c5_caseD_31:
          if ((uint)rc_in_pos < 0x1000000) {
            if (_state == dict._40_8_) {
              coder->sequence = SEQ_IS_REP0;
              goto LAB_00ad3ce0;
            }
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
            _state = _state + 1;
          }
          uVar8 = ((uint)rc_in_pos >> 0xb) * (uint)coder->is_rep0[rep1];
          if (rc_in_pos._4_4_ < uVar8) {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
            coder->is_rep0[rep1] = coder->is_rep0[rep1] + (short)(0x800 - coder->is_rep0[rep1] >> 5)
            ;
switchD_00acd5c5_caseD_33:
            if ((uint)rc_in_pos < 0x1000000) {
              if (_state == dict._40_8_) {
                coder->sequence = SEQ_IS_REP0_LONG;
                goto LAB_00ad3ce0;
              }
              rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
              _state = _state + 1;
            }
            rep0 = ((uint)rc_in_pos >> 0xb) * (uint)coder->is_rep0_long[rep1][uStack_cc];
            if (rc_in_pos._4_4_ < rep0) {
              rc_in_pos = CONCAT44(rc_in_pos._4_4_,rep0);
              coder->is_rep0_long[rep1][uStack_cc] =
                   coder->is_rep0_long[rep1][uStack_cc] +
                   (short)(0x800 - coder->is_rep0_long[rep1][uStack_cc] >> 5);
              bVar13 = rep1 < 7;
              rep1 = 0xb;
              if (bVar13) {
                rep1 = 9;
              }
switchD_00acd5c5_caseD_32:
              byte = dict_get((lzma_dict *)&dict_start,rep2);
              _Var6 = dict_put((lzma_dict *)&dict_start,byte);
              if (!_Var6) goto LAB_00acd5c7;
              coder->sequence = SEQ_SHORTREP;
              goto LAB_00ad3ce0;
            }
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ - rep0,(uint)rc_in_pos - rep0);
            coder->is_rep0_long[rep1][uStack_cc] =
                 coder->is_rep0_long[rep1][uStack_cc] -
                 (short)((int)(uint)coder->is_rep0_long[rep1][uStack_cc] >> 5);
          }
          else {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
            coder->is_rep0[rep1] =
                 coder->is_rep0[rep1] - (short)((int)(uint)coder->is_rep0[rep1] >> 5);
switchD_00acd5c5_caseD_34:
            uVar5 = rep3;
            if ((uint)rc_in_pos < 0x1000000) {
              if (_state == dict._40_8_) {
                coder->sequence = SEQ_IS_REP1;
                goto LAB_00ad3ce0;
              }
              rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
              _state = _state + 1;
            }
            uVar8 = ((uint)rc_in_pos >> 0xb) * (uint)coder->is_rep1[rep1];
            if (rc_in_pos._4_4_ < uVar8) {
              rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
              coder->is_rep1[rep1] =
                   coder->is_rep1[rep1] + (short)(0x800 - coder->is_rep1[rep1] >> 5);
              rep3 = rep2;
              rep2 = uVar5;
            }
            else {
              rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
              coder->is_rep1[rep1] =
                   coder->is_rep1[rep1] - (short)((int)(uint)coder->is_rep1[rep1] >> 5);
switchD_00acd5c5_caseD_35:
              uVar4 = rep2;
              uVar3 = rep3;
              uVar5 = local_a0;
              if ((uint)rc_in_pos < 0x1000000) {
                if (_state == dict._40_8_) {
                  coder->sequence = SEQ_IS_REP2;
                  goto LAB_00ad3ce0;
                }
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
                _state = _state + 1;
              }
              uVar8 = ((uint)rc_in_pos >> 0xb) * (uint)coder->is_rep2[rep1];
              if (rc_in_pos._4_4_ < uVar8) {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
                coder->is_rep2[rep1] =
                     coder->is_rep2[rep1] + (short)(0x800 - coder->is_rep2[rep1] >> 5);
                rep2 = pos_mask;
              }
              else {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
                coder->is_rep2[rep1] =
                     coder->is_rep2[rep1] - (short)((int)(uint)coder->is_rep2[rep1] >> 5);
                local_a0 = pos_mask;
                rep2 = uVar5;
              }
              rep3 = uVar4;
              pos_mask = uVar3;
            }
          }
          bVar13 = rep1 < 7;
          rep1 = 0xb;
          if (bVar13) {
            rep1 = 8;
          }
          offset = 1;
switchD_00acd5c5_caseD_36:
          if ((uint)rc_in_pos < 0x1000000) {
            if (_state == dict._40_8_) {
              coder->sequence = SEQ_REP_LEN_CHOICE;
              goto LAB_00ad3ce0;
            }
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
            _state = _state + 1;
          }
          uVar8 = ((uint)rc_in_pos >> 0xb) * (uint)(coder->rep_len_decoder).choice;
          if (rc_in_pos._4_4_ < uVar8) {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
            (coder->rep_len_decoder).choice =
                 (coder->rep_len_decoder).choice +
                 (short)(0x800 - (coder->rep_len_decoder).choice >> 5);
switchD_00acd5c5_caseD_37:
            if ((uint)rc_in_pos < 0x1000000) {
              if (_state == dict._40_8_) {
                coder->sequence = SEQ_REP_LEN_LOW0;
                goto LAB_00ad3ce0;
              }
              rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
              _state = _state + 1;
            }
            uVar8 = ((uint)rc_in_pos >> 0xb) * (uint)(coder->rep_len_decoder).low[uStack_cc][offset]
            ;
            if (rc_in_pos._4_4_ < uVar8) {
              rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
              (coder->rep_len_decoder).low[uStack_cc][offset] =
                   (coder->rep_len_decoder).low[uStack_cc][offset] +
                   (short)(0x800 - (coder->rep_len_decoder).low[uStack_cc][offset] >> 5);
              offset = offset << 1;
            }
            else {
              rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
              (coder->rep_len_decoder).low[uStack_cc][offset] =
                   (coder->rep_len_decoder).low[uStack_cc][offset] -
                   (short)((int)(uint)(coder->rep_len_decoder).low[uStack_cc][offset] >> 5);
              offset = offset * 2 + 1;
            }
switchD_00acd5c5_caseD_38:
            if ((uint)rc_in_pos < 0x1000000) {
              if (_state == dict._40_8_) {
                coder->sequence = SEQ_REP_LEN_LOW1;
                goto LAB_00ad3ce0;
              }
              rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
              _state = _state + 1;
            }
            uVar8 = ((uint)rc_in_pos >> 0xb) * (uint)(coder->rep_len_decoder).low[uStack_cc][offset]
            ;
            if (rc_in_pos._4_4_ < uVar8) {
              rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
              (coder->rep_len_decoder).low[uStack_cc][offset] =
                   (coder->rep_len_decoder).low[uStack_cc][offset] +
                   (short)(0x800 - (coder->rep_len_decoder).low[uStack_cc][offset] >> 5);
              offset = offset << 1;
            }
            else {
              rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
              (coder->rep_len_decoder).low[uStack_cc][offset] =
                   (coder->rep_len_decoder).low[uStack_cc][offset] -
                   (short)((int)(uint)(coder->rep_len_decoder).low[uStack_cc][offset] >> 5);
              offset = offset * 2 + 1;
            }
switchD_00acd5c5_caseD_39:
            if ((uint)rc_in_pos < 0x1000000) {
              if (_state == dict._40_8_) {
                coder->sequence = SEQ_REP_LEN_LOW2;
                goto LAB_00ad3ce0;
              }
              rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
              _state = _state + 1;
            }
            rep0 = ((uint)rc_in_pos >> 0xb) * (uint)(coder->rep_len_decoder).low[uStack_cc][offset];
            if (rc_in_pos._4_4_ < rep0) {
              rc_in_pos = CONCAT44(rc_in_pos._4_4_,rep0);
              (coder->rep_len_decoder).low[uStack_cc][offset] =
                   (coder->rep_len_decoder).low[uStack_cc][offset] +
                   (short)(0x800 - (coder->rep_len_decoder).low[uStack_cc][offset] >> 5);
              offset = offset << 1;
            }
            else {
              rc_in_pos = CONCAT44(rc_in_pos._4_4_ - rep0,(uint)rc_in_pos - rep0);
              (coder->rep_len_decoder).low[uStack_cc][offset] =
                   (coder->rep_len_decoder).low[uStack_cc][offset] -
                   (short)((int)(uint)(coder->rep_len_decoder).low[uStack_cc][offset] >> 5);
              offset = offset * 2 + 1;
            }
            literal_context_bits = offset - 6;
          }
          else {
            rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
            (coder->rep_len_decoder).choice =
                 (coder->rep_len_decoder).choice -
                 (short)((int)(uint)(coder->rep_len_decoder).choice >> 5);
switchD_00acd5c5_caseD_3a:
            if ((uint)rc_in_pos < 0x1000000) {
              if (_state == dict._40_8_) {
                coder->sequence = SEQ_REP_LEN_CHOICE2;
                goto LAB_00ad3ce0;
              }
              rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
              _state = _state + 1;
            }
            uVar8 = ((uint)rc_in_pos >> 0xb) * (uint)(coder->rep_len_decoder).choice2;
            if (rc_in_pos._4_4_ < uVar8) {
              rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
              (coder->rep_len_decoder).choice2 =
                   (coder->rep_len_decoder).choice2 +
                   (short)(0x800 - (coder->rep_len_decoder).choice2 >> 5);
switchD_00acd5c5_caseD_3b:
              if ((uint)rc_in_pos < 0x1000000) {
                if (_state == dict._40_8_) {
                  coder->sequence = SEQ_REP_LEN_MID0;
                  goto LAB_00ad3ce0;
                }
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
                _state = _state + 1;
              }
              uVar8 = ((uint)rc_in_pos >> 0xb) *
                      (uint)(coder->rep_len_decoder).mid[uStack_cc][offset];
              if (rc_in_pos._4_4_ < uVar8) {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
                (coder->rep_len_decoder).mid[uStack_cc][offset] =
                     (coder->rep_len_decoder).mid[uStack_cc][offset] +
                     (short)(0x800 - (coder->rep_len_decoder).mid[uStack_cc][offset] >> 5);
                offset = offset << 1;
              }
              else {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
                (coder->rep_len_decoder).mid[uStack_cc][offset] =
                     (coder->rep_len_decoder).mid[uStack_cc][offset] -
                     (short)((int)(uint)(coder->rep_len_decoder).mid[uStack_cc][offset] >> 5);
                offset = offset * 2 + 1;
              }
switchD_00acd5c5_caseD_3c:
              if ((uint)rc_in_pos < 0x1000000) {
                if (_state == dict._40_8_) {
                  coder->sequence = SEQ_REP_LEN_MID1;
                  goto LAB_00ad3ce0;
                }
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
                _state = _state + 1;
              }
              uVar8 = ((uint)rc_in_pos >> 0xb) *
                      (uint)(coder->rep_len_decoder).mid[uStack_cc][offset];
              if (rc_in_pos._4_4_ < uVar8) {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
                (coder->rep_len_decoder).mid[uStack_cc][offset] =
                     (coder->rep_len_decoder).mid[uStack_cc][offset] +
                     (short)(0x800 - (coder->rep_len_decoder).mid[uStack_cc][offset] >> 5);
                offset = offset << 1;
              }
              else {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
                (coder->rep_len_decoder).mid[uStack_cc][offset] =
                     (coder->rep_len_decoder).mid[uStack_cc][offset] -
                     (short)((int)(uint)(coder->rep_len_decoder).mid[uStack_cc][offset] >> 5);
                offset = offset * 2 + 1;
              }
switchD_00acd5c5_caseD_3d:
              if ((uint)rc_in_pos < 0x1000000) {
                if (_state == dict._40_8_) {
                  coder->sequence = SEQ_REP_LEN_MID2;
                  goto LAB_00ad3ce0;
                }
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
                _state = _state + 1;
              }
              rep0 = ((uint)rc_in_pos >> 0xb) *
                     (uint)(coder->rep_len_decoder).mid[uStack_cc][offset];
              if (rc_in_pos._4_4_ < rep0) {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_,rep0);
                (coder->rep_len_decoder).mid[uStack_cc][offset] =
                     (coder->rep_len_decoder).mid[uStack_cc][offset] +
                     (short)(0x800 - (coder->rep_len_decoder).mid[uStack_cc][offset] >> 5);
                offset = offset << 1;
              }
              else {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ - rep0,(uint)rc_in_pos - rep0);
                (coder->rep_len_decoder).mid[uStack_cc][offset] =
                     (coder->rep_len_decoder).mid[uStack_cc][offset] -
                     (short)((int)(uint)(coder->rep_len_decoder).mid[uStack_cc][offset] >> 5);
                offset = offset * 2 + 1;
              }
              literal_context_bits = offset + 2;
            }
            else {
              rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
              (coder->rep_len_decoder).choice2 =
                   (coder->rep_len_decoder).choice2 -
                   (short)((int)(uint)(coder->rep_len_decoder).choice2 >> 5);
switchD_00acd5c5_caseD_3e:
              if ((uint)rc_in_pos < 0x1000000) {
                if (_state == dict._40_8_) {
                  coder->sequence = SEQ_REP_LEN_HIGH0;
                  goto LAB_00ad3ce0;
                }
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
                _state = _state + 1;
              }
              uVar8 = ((uint)rc_in_pos >> 0xb) * (uint)(coder->rep_len_decoder).high[offset];
              if (rc_in_pos._4_4_ < uVar8) {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
                (coder->rep_len_decoder).high[offset] =
                     (coder->rep_len_decoder).high[offset] +
                     (short)(0x800 - (coder->rep_len_decoder).high[offset] >> 5);
                offset = offset << 1;
              }
              else {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
                (coder->rep_len_decoder).high[offset] =
                     (coder->rep_len_decoder).high[offset] -
                     (short)((int)(uint)(coder->rep_len_decoder).high[offset] >> 5);
                offset = offset * 2 + 1;
              }
switchD_00acd5c5_caseD_3f:
              if ((uint)rc_in_pos < 0x1000000) {
                if (_state == dict._40_8_) {
                  coder->sequence = SEQ_REP_LEN_HIGH1;
                  goto LAB_00ad3ce0;
                }
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
                _state = _state + 1;
              }
              uVar8 = ((uint)rc_in_pos >> 0xb) * (uint)(coder->rep_len_decoder).high[offset];
              if (rc_in_pos._4_4_ < uVar8) {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
                (coder->rep_len_decoder).high[offset] =
                     (coder->rep_len_decoder).high[offset] +
                     (short)(0x800 - (coder->rep_len_decoder).high[offset] >> 5);
                offset = offset << 1;
              }
              else {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
                (coder->rep_len_decoder).high[offset] =
                     (coder->rep_len_decoder).high[offset] -
                     (short)((int)(uint)(coder->rep_len_decoder).high[offset] >> 5);
                offset = offset * 2 + 1;
              }
switchD_00acd5c5_caseD_40:
              if ((uint)rc_in_pos < 0x1000000) {
                if (_state == dict._40_8_) {
                  coder->sequence = SEQ_REP_LEN_HIGH2;
                  goto LAB_00ad3ce0;
                }
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
                _state = _state + 1;
              }
              uVar8 = ((uint)rc_in_pos >> 0xb) * (uint)(coder->rep_len_decoder).high[offset];
              if (rc_in_pos._4_4_ < uVar8) {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
                (coder->rep_len_decoder).high[offset] =
                     (coder->rep_len_decoder).high[offset] +
                     (short)(0x800 - (coder->rep_len_decoder).high[offset] >> 5);
                offset = offset << 1;
              }
              else {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
                (coder->rep_len_decoder).high[offset] =
                     (coder->rep_len_decoder).high[offset] -
                     (short)((int)(uint)(coder->rep_len_decoder).high[offset] >> 5);
                offset = offset * 2 + 1;
              }
switchD_00acd5c5_caseD_41:
              if ((uint)rc_in_pos < 0x1000000) {
                if (_state == dict._40_8_) {
                  coder->sequence = SEQ_REP_LEN_HIGH3;
                  goto LAB_00ad3ce0;
                }
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
                _state = _state + 1;
              }
              uVar8 = ((uint)rc_in_pos >> 0xb) * (uint)(coder->rep_len_decoder).high[offset];
              if (rc_in_pos._4_4_ < uVar8) {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
                (coder->rep_len_decoder).high[offset] =
                     (coder->rep_len_decoder).high[offset] +
                     (short)(0x800 - (coder->rep_len_decoder).high[offset] >> 5);
                offset = offset << 1;
              }
              else {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
                (coder->rep_len_decoder).high[offset] =
                     (coder->rep_len_decoder).high[offset] -
                     (short)((int)(uint)(coder->rep_len_decoder).high[offset] >> 5);
                offset = offset * 2 + 1;
              }
switchD_00acd5c5_caseD_42:
              if ((uint)rc_in_pos < 0x1000000) {
                if (_state == dict._40_8_) {
                  coder->sequence = SEQ_REP_LEN_HIGH4;
                  goto LAB_00ad3ce0;
                }
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
                _state = _state + 1;
              }
              uVar8 = ((uint)rc_in_pos >> 0xb) * (uint)(coder->rep_len_decoder).high[offset];
              if (rc_in_pos._4_4_ < uVar8) {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
                (coder->rep_len_decoder).high[offset] =
                     (coder->rep_len_decoder).high[offset] +
                     (short)(0x800 - (coder->rep_len_decoder).high[offset] >> 5);
                offset = offset << 1;
              }
              else {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
                (coder->rep_len_decoder).high[offset] =
                     (coder->rep_len_decoder).high[offset] -
                     (short)((int)(uint)(coder->rep_len_decoder).high[offset] >> 5);
                offset = offset * 2 + 1;
              }
switchD_00acd5c5_caseD_43:
              if ((uint)rc_in_pos < 0x1000000) {
                if (_state == dict._40_8_) {
                  coder->sequence = SEQ_REP_LEN_HIGH5;
                  goto LAB_00ad3ce0;
                }
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
                _state = _state + 1;
              }
              uVar8 = ((uint)rc_in_pos >> 0xb) * (uint)(coder->rep_len_decoder).high[offset];
              if (rc_in_pos._4_4_ < uVar8) {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
                (coder->rep_len_decoder).high[offset] =
                     (coder->rep_len_decoder).high[offset] +
                     (short)(0x800 - (coder->rep_len_decoder).high[offset] >> 5);
                offset = offset << 1;
              }
              else {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
                (coder->rep_len_decoder).high[offset] =
                     (coder->rep_len_decoder).high[offset] -
                     (short)((int)(uint)(coder->rep_len_decoder).high[offset] >> 5);
                offset = offset * 2 + 1;
              }
switchD_00acd5c5_caseD_44:
              if ((uint)rc_in_pos < 0x1000000) {
                if (_state == dict._40_8_) {
                  coder->sequence = SEQ_REP_LEN_HIGH6;
                  goto LAB_00ad3ce0;
                }
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
                _state = _state + 1;
              }
              uVar8 = ((uint)rc_in_pos >> 0xb) * (uint)(coder->rep_len_decoder).high[offset];
              if (rc_in_pos._4_4_ < uVar8) {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_,uVar8);
                (coder->rep_len_decoder).high[offset] =
                     (coder->rep_len_decoder).high[offset] +
                     (short)(0x800 - (coder->rep_len_decoder).high[offset] >> 5);
                offset = offset << 1;
              }
              else {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ - uVar8,(uint)rc_in_pos - uVar8);
                (coder->rep_len_decoder).high[offset] =
                     (coder->rep_len_decoder).high[offset] -
                     (short)((int)(uint)(coder->rep_len_decoder).high[offset] >> 5);
                offset = offset * 2 + 1;
              }
switchD_00acd5c5_caseD_45:
              if ((uint)rc_in_pos < 0x1000000) {
                if (_state == dict._40_8_) {
                  coder->sequence = SEQ_REP_LEN_HIGH7;
                  goto LAB_00ad3ce0;
                }
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
                _state = _state + 1;
              }
              rep0 = ((uint)rc_in_pos >> 0xb) * (uint)(coder->rep_len_decoder).high[offset];
              if (rc_in_pos._4_4_ < rep0) {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_,rep0);
                (coder->rep_len_decoder).high[offset] =
                     (coder->rep_len_decoder).high[offset] +
                     (short)(0x800 - (coder->rep_len_decoder).high[offset] >> 5);
                offset = offset << 1;
              }
              else {
                rc_in_pos = CONCAT44(rc_in_pos._4_4_ - rep0,(uint)rc_in_pos - rep0);
                (coder->rep_len_decoder).high[offset] =
                     (coder->rep_len_decoder).high[offset] -
                     (short)((int)(uint)(coder->rep_len_decoder).high[offset] >> 5);
                offset = offset * 2 + 1;
              }
              literal_context_bits = offset - 0xee;
            }
          }
        }
        if (literal_context_bits < 2) {
          __assert_fail("len >= MATCH_LEN_MIN",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                        ,0x312,
                        "lzma_ret lzma_decode(lzma_coder *restrict, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                       );
        }
        if (0x111 < literal_context_bits) {
          __assert_fail("len <= MATCH_LEN_MAX",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                        ,0x313,
                        "lzma_ret lzma_decode(lzma_coder *restrict, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                       );
        }
switchD_00acd5c5_caseD_46:
        _Var6 = dict_repeat((lzma_dict *)&dict_start,rep2,&literal_context_bits);
        if (_Var6) {
          coder->sequence = SEQ_COPY;
          goto LAB_00ad3ce0;
        }
      }
LAB_00acd5c7:
      uStack_cc = (uint)dict.buf & probs._4_4_;
    }
    break;
  case SEQ_BLOCK:
    goto switchD_00acd5c5_caseD_2;
  case SEQ_CODER_INIT:
    goto switchD_00acd5c5_caseD_3;
  case SEQ_CODE:
    goto switchD_00acd5c5_caseD_4;
  case SEQ_LITERAL3:
    goto switchD_00acd5c5_caseD_5;
  case SEQ_CRC32:
    goto switchD_00acd5c5_caseD_6;
  case SEQ_LITERAL5:
    goto switchD_00acd5c5_caseD_7;
  case SEQ_LITERAL6:
    goto switchD_00acd5c5_caseD_8;
  case SEQ_LITERAL7:
    goto switchD_00acd5c5_caseD_9;
  case SEQ_LITERAL_MATCHED0:
    goto switchD_00acd5c5_caseD_a;
  case SEQ_LITERAL_MATCHED1:
    goto switchD_00acd5c5_caseD_b;
  case SEQ_LITERAL_MATCHED2:
    goto switchD_00acd5c5_caseD_c;
  case SEQ_LITERAL_MATCHED3:
    goto switchD_00acd5c5_caseD_d;
  case SEQ_LITERAL_MATCHED4:
    goto switchD_00acd5c5_caseD_e;
  case SEQ_LITERAL_MATCHED5:
    goto switchD_00acd5c5_caseD_f;
  case SEQ_LITERAL_MATCHED6:
    goto switchD_00acd5c5_caseD_10;
  case SEQ_LITERAL_MATCHED7:
    goto switchD_00acd5c5_caseD_11;
  case SEQ_LITERAL_WRITE:
    goto switchD_00acd5c5_caseD_12;
  case SEQ_IS_REP:
    goto switchD_00acd5c5_caseD_13;
  case SEQ_MATCH_LEN_CHOICE:
    goto switchD_00acd5c5_caseD_14;
  case SEQ_MATCH_LEN_LOW0:
    goto switchD_00acd5c5_caseD_15;
  case SEQ_MATCH_LEN_LOW1:
    goto switchD_00acd5c5_caseD_16;
  case SEQ_MATCH_LEN_LOW2:
    goto switchD_00acd5c5_caseD_17;
  case SEQ_MATCH_LEN_CHOICE2:
    goto switchD_00acd5c5_caseD_18;
  case SEQ_MATCH_LEN_MID0:
    goto switchD_00acd5c5_caseD_19;
  case SEQ_MATCH_LEN_MID1:
    goto switchD_00acd5c5_caseD_1a;
  case SEQ_MATCH_LEN_MID2:
    goto switchD_00acd5c5_caseD_1b;
  case SEQ_MATCH_LEN_HIGH0:
    goto switchD_00acd5c5_caseD_1c;
  case SEQ_MATCH_LEN_HIGH1:
    goto switchD_00acd5c5_caseD_1d;
  case SEQ_MATCH_LEN_HIGH2:
    goto switchD_00acd5c5_caseD_1e;
  case SEQ_MATCH_LEN_HIGH3:
    goto switchD_00acd5c5_caseD_1f;
  case SEQ_MATCH_LEN_HIGH4:
    goto switchD_00acd5c5_caseD_20;
  case SEQ_MATCH_LEN_HIGH5:
    goto switchD_00acd5c5_caseD_21;
  case SEQ_MATCH_LEN_HIGH6:
    goto switchD_00acd5c5_caseD_22;
  case SEQ_MATCH_LEN_HIGH7:
    goto switchD_00acd5c5_caseD_23;
  case SEQ_POS_SLOT0:
    goto switchD_00acd5c5_caseD_24;
  case SEQ_POS_SLOT1:
    goto switchD_00acd5c5_caseD_25;
  case SEQ_POS_SLOT2:
    goto switchD_00acd5c5_caseD_26;
  case SEQ_POS_SLOT3:
    goto switchD_00acd5c5_caseD_27;
  case SEQ_POS_SLOT4:
    goto switchD_00acd5c5_caseD_28;
  case SEQ_POS_SLOT5:
    goto switchD_00acd5c5_caseD_29;
  case SEQ_POS_MODEL:
    goto switchD_00acd5c5_caseD_2a;
  case SEQ_DIRECT:
    goto switchD_00acd5c5_caseD_2b;
  case SEQ_ALIGN0:
    goto switchD_00acd5c5_caseD_2c;
  case SEQ_ALIGN1:
    goto switchD_00acd5c5_caseD_2d;
  case SEQ_ALIGN2:
    goto switchD_00acd5c5_caseD_2e;
  case SEQ_ALIGN3:
    goto switchD_00acd5c5_caseD_2f;
  case SEQ_EOPM:
switchD_00acd5c5_caseD_30:
    if ((uint)rc_in_pos < 0x1000000) {
      if (_state == dict._40_8_) {
        coder->sequence = SEQ_EOPM;
        goto LAB_00ad3ce0;
      }
      rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
      _state = _state + 1;
    }
    match_bit = 1;
    goto LAB_00ad3ce0;
  case SEQ_IS_REP0:
    goto switchD_00acd5c5_caseD_31;
  case SEQ_SHORTREP:
    goto switchD_00acd5c5_caseD_32;
  case SEQ_IS_REP0_LONG:
    goto switchD_00acd5c5_caseD_33;
  case SEQ_IS_REP1:
    goto switchD_00acd5c5_caseD_34;
  case SEQ_IS_REP2:
    goto switchD_00acd5c5_caseD_35;
  case SEQ_REP_LEN_CHOICE:
    goto switchD_00acd5c5_caseD_36;
  case SEQ_REP_LEN_LOW0:
    goto switchD_00acd5c5_caseD_37;
  case SEQ_REP_LEN_LOW1:
    goto switchD_00acd5c5_caseD_38;
  case SEQ_REP_LEN_LOW2:
    goto switchD_00acd5c5_caseD_39;
  case SEQ_REP_LEN_CHOICE2:
    goto switchD_00acd5c5_caseD_3a;
  case SEQ_REP_LEN_MID0:
    goto switchD_00acd5c5_caseD_3b;
  case SEQ_REP_LEN_MID1:
    goto switchD_00acd5c5_caseD_3c;
  case SEQ_REP_LEN_MID2:
    goto switchD_00acd5c5_caseD_3d;
  case SEQ_REP_LEN_HIGH0:
    goto switchD_00acd5c5_caseD_3e;
  case SEQ_REP_LEN_HIGH1:
    goto switchD_00acd5c5_caseD_3f;
  case SEQ_REP_LEN_HIGH2:
    goto switchD_00acd5c5_caseD_40;
  case SEQ_REP_LEN_HIGH3:
    goto switchD_00acd5c5_caseD_41;
  case SEQ_REP_LEN_HIGH4:
    goto switchD_00acd5c5_caseD_42;
  case SEQ_REP_LEN_HIGH5:
    goto switchD_00acd5c5_caseD_43;
  case SEQ_REP_LEN_HIGH6:
    goto switchD_00acd5c5_caseD_44;
  case SEQ_REP_LEN_HIGH7:
    goto switchD_00acd5c5_caseD_45;
  case SEQ_COPY:
    goto switchD_00acd5c5_caseD_46;
  }
  if ((uint)rc_in_pos < 0x1000000) {
    if (_state == dict._40_8_) {
      coder->sequence = SEQ_INDICATOR;
      goto LAB_00ad3ce0;
    }
    rc_in_pos = CONCAT44(rc_in_pos._4_4_ << 8 | (uint)in[_state],(uint)rc_in_pos << 8);
    _state = _state + 1;
  }
  coder->sequence = SEQ_BLOCK_HEADER;
LAB_00ad3ce0:
  dictptr->pos = (size_t)dict.buf;
  dictptr->full = dict.pos;
  (coder->rc).range = (uint)rc_in_pos;
  (coder->rc).code = rc_in_pos._4_4_;
  (coder->rc).init_bytes_left = rc.range;
  *in_pos = _state;
  coder->state = rep1;
  coder->rep0 = rep2;
  coder->rep1 = rep3;
  coder->rep2 = pos_mask;
  coder->rep3 = local_a0;
  coder->probs = *_limit;
  coder->symbol = offset;
  coder->limit = len;
  coder->offset = literal_pos_mask;
  coder->len = literal_context_bits;
  if ((((coder->uncompressed_size != 0xffffffffffffffff) &&
       (coder->uncompressed_size =
             coder->uncompressed_size - ((long)dict.buf - (long)stack0xffffffffffffff90),
       coder->uncompressed_size == 0)) && (match_bit == 0)) &&
     ((coder->sequence != SEQ_INDICATOR && (match_bit = 9, coder->sequence == SEQ_BLOCK_HEADER)))) {
    match_bit = 1;
  }
  if (match_bit == 1) {
    if ((coder->rc).code != 0) {
      match_bit = 9;
    }
    (coder->rc).range = 0xffffffff;
    (coder->rc).code = 0;
    (coder->rc).init_bytes_left = 5;
  }
  return match_bit;
}

Assistant:

static lzma_ret
lzma_decode(lzma_coder *LZMA_RESTRICT coder, lzma_dict *LZMA_RESTRICT dictptr,
		const uint8_t *LZMA_RESTRICT in,
		size_t *LZMA_RESTRICT in_pos, size_t in_size)
{
	///////////////
	// Variables //
	///////////////

	// Making local copies of often-used variables improves both
	// speed and readability.

	lzma_dict dict = *dictptr;

	const size_t dict_start = dict.pos;

	// Range decoder
	rc_to_local(coder->rc, *in_pos);

	// State
	uint32_t state = coder->state;
	uint32_t rep0 = coder->rep0;
	uint32_t rep1 = coder->rep1;
	uint32_t rep2 = coder->rep2;
	uint32_t rep3 = coder->rep3;

	const uint32_t pos_mask = coder->pos_mask;

	// These variables are actually needed only if we last time ran
	// out of input in the middle of the decoder loop.
	probability *probs = coder->probs;
	uint32_t symbol = coder->symbol;
	uint32_t limit = coder->limit;
	uint32_t offset = coder->offset;
	uint32_t len = coder->len;

	const uint32_t literal_pos_mask = coder->literal_pos_mask;
	const uint32_t literal_context_bits = coder->literal_context_bits;

	// Temporary variables
	uint32_t pos_state = dict.pos & pos_mask;

	lzma_ret ret = LZMA_OK;

	// If uncompressed size is known, there must be no end of payload
	// marker.
	const bool no_eopm = coder->uncompressed_size
			!= LZMA_VLI_UNKNOWN;
	if (no_eopm && coder->uncompressed_size < dict.limit - dict.pos)
		dict.limit = dict.pos + (size_t)(coder->uncompressed_size);

	////////////////////
	// Initialization //
	////////////////////

	if (!rc_read_init(&coder->rc, in, in_pos, in_size))
		return LZMA_OK;

	rc = coder->rc;
	rc_in_pos = *in_pos;

	// The main decoder loop. The "switch" is used to restart the decoder at
	// correct location. Once restarted, the "switch" is no longer used.
	switch (coder->sequence)
	while (true) {
		// Calculate new pos_state. This is skipped on the first loop
		// since we already calculated it when setting up the local
		// variables.
		pos_state = dict.pos & pos_mask;

	case SEQ_NORMALIZE:
	case SEQ_IS_MATCH:
		if (unlikely(no_eopm && dict.pos == dict.limit))
			break;

		rc_if_0(coder->is_match[state][pos_state], SEQ_IS_MATCH) {
			static const lzma_lzma_state next_state[] = {
				STATE_LIT_LIT,
				STATE_LIT_LIT,
				STATE_LIT_LIT,
				STATE_LIT_LIT,
				STATE_MATCH_LIT_LIT,
				STATE_REP_LIT_LIT,
				STATE_SHORTREP_LIT_LIT,
				STATE_MATCH_LIT,
				STATE_REP_LIT,
				STATE_SHORTREP_LIT,
				STATE_MATCH_LIT,
				STATE_REP_LIT
			};

			rc_update_0(coder->is_match[state][pos_state]);

			// It's a literal i.e. a single 8-bit byte.

			probs = literal_subcoder(coder->literal,
					literal_context_bits, literal_pos_mask,
					dict.pos, dict_get(&dict, 0));
			symbol = 1;

			if (is_literal_state(state)) {
				// Decode literal without match byte.
#ifdef HAVE_SMALL
	case SEQ_LITERAL:
				do {
					rc_bit(probs[symbol], , , SEQ_LITERAL);
				} while (symbol < (1 << 8));
#else
				rc_bit_case(probs[symbol], 0, 0, SEQ_LITERAL0);
				rc_bit_case(probs[symbol], 0, 0, SEQ_LITERAL1);
				rc_bit_case(probs[symbol], 0, 0, SEQ_LITERAL2);
				rc_bit_case(probs[symbol], 0, 0, SEQ_LITERAL3);
				rc_bit_case(probs[symbol], 0, 0, SEQ_LITERAL4);
				rc_bit_case(probs[symbol], 0, 0, SEQ_LITERAL5);
				rc_bit_case(probs[symbol], 0, 0, SEQ_LITERAL6);
				rc_bit_case(probs[symbol], 0, 0, SEQ_LITERAL7);
#endif
			} else {
#ifndef HAVE_SMALL
				uint32_t match_bit;
				uint32_t subcoder_index;
#endif

				// Decode literal with match byte.
				//
				// We store the byte we compare against
				// ("match byte") to "len" to minimize the
				// number of variables we need to store
				// between decoder calls.
				len = dict_get(&dict, rep0) << 1;

				// The usage of "offset" allows omitting some
				// branches, which should give tiny speed
				// improvement on some CPUs. "offset" gets
				// set to zero if match_bit didn't match.
				offset = 0x100;

#ifdef HAVE_SMALL
	case SEQ_LITERAL_MATCHED:
				do {
					const uint32_t match_bit
							= len & offset;
					const uint32_t subcoder_index
							= offset + match_bit
							+ symbol;

					rc_bit(probs[subcoder_index],
							offset &= ~match_bit,
							offset &= match_bit,
							SEQ_LITERAL_MATCHED);

					// It seems to be faster to do this
					// here instead of putting it to the
					// beginning of the loop and then
					// putting the "case" in the middle
					// of the loop.
					len <<= 1;

				} while (symbol < (1 << 8));
#else
				// Unroll the loop.

#	define d(seq) \
		case seq: \
			match_bit = len & offset; \
			subcoder_index = offset + match_bit + symbol; \
			rc_bit(probs[subcoder_index], \
					offset &= ~match_bit, \
					offset &= match_bit, \
					seq)

				d(SEQ_LITERAL_MATCHED0);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED1);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED2);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED3);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED4);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED5);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED6);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED7);
#	undef d
#endif
			}

			//update_literal(state);
			// Use a lookup table to update to literal state,
			// since compared to other state updates, this would
			// need two branches.
			state = next_state[state];

	case SEQ_LITERAL_WRITE:
			if (unlikely(dict_put(&dict, symbol))) {
				coder->sequence = SEQ_LITERAL_WRITE;
				goto out;
			}

			continue;
		}

		// Instead of a new byte we are going to get a byte range
		// (distance and length) which will be repeated from our
		// output history.

		rc_update_1(coder->is_match[state][pos_state]);

	case SEQ_IS_REP:
		rc_if_0(coder->is_rep[state], SEQ_IS_REP) {
			// Not a repeated match
			rc_update_0(coder->is_rep[state]);
			update_match(state);

			// The latest three match distances are kept in
			// memory in case there are repeated matches.
			rep3 = rep2;
			rep2 = rep1;
			rep1 = rep0;

			// Decode the length of the match.
			len_decode(len, coder->match_len_decoder,
					pos_state, SEQ_MATCH_LEN);

			// Prepare to decode the highest two bits of the
			// match distance.
			probs = coder->pos_slot[get_len_to_pos_state(len)];
			symbol = 1;

#ifdef HAVE_SMALL
	case SEQ_POS_SLOT:
			do {
				rc_bit(probs[symbol], , , SEQ_POS_SLOT);
			} while (symbol < POS_SLOTS);
#else
			rc_bit_case(probs[symbol], 0, 0, SEQ_POS_SLOT0);
			rc_bit_case(probs[symbol], 0, 0, SEQ_POS_SLOT1);
			rc_bit_case(probs[symbol], 0, 0, SEQ_POS_SLOT2);
			rc_bit_case(probs[symbol], 0, 0, SEQ_POS_SLOT3);
			rc_bit_case(probs[symbol], 0, 0, SEQ_POS_SLOT4);
			rc_bit_case(probs[symbol], 0, 0, SEQ_POS_SLOT5);
#endif
			// Get rid of the highest bit that was needed for
			// indexing of the probability array.
			symbol -= POS_SLOTS;
			assert(symbol <= 63);

			if (symbol < START_POS_MODEL_INDEX) {
				// Match distances [0, 3] have only two bits.
				rep0 = symbol;
			} else {
				// Decode the lowest [1, 29] bits of
				// the match distance.
				limit = (symbol >> 1) - 1;
				assert(limit >= 1 && limit <= 30);
				rep0 = 2 + (symbol & 1);

				if (symbol < END_POS_MODEL_INDEX) {
					// Prepare to decode the low bits for
					// a distance of [4, 127].
					assert(limit <= 5);
					rep0 <<= limit;
					assert(rep0 <= 96);
					// -1 is fine, because we start
					// decoding at probs[1], not probs[0].
					// NOTE: This violates the C standard,
					// since we are doing pointer
					// arithmetic past the beginning of
					// the array.
					assert((int32_t)(rep0 - symbol - 1)
							>= -1);
					assert((int32_t)(rep0 - symbol - 1)
							<= 82);
					probs = coder->pos_special + rep0
							- symbol - 1;
					symbol = 1;
					offset = 0;
	case SEQ_POS_MODEL:
#ifdef HAVE_SMALL
					do {
						rc_bit(probs[symbol], ,
							rep0 += 1 << offset,
							SEQ_POS_MODEL);
					} while (++offset < limit);
#else
					switch (limit) {
					case 5:
						assert(offset == 0);
						rc_bit(probs[symbol], 0,
							rep0 += 1,
							SEQ_POS_MODEL);
						++offset;
						--limit;
					case 4:
						rc_bit(probs[symbol], 0,
							rep0 += 1 << offset,
							SEQ_POS_MODEL);
						++offset;
						--limit;
					case 3:
						rc_bit(probs[symbol], 0,
							rep0 += 1 << offset,
							SEQ_POS_MODEL);
						++offset;
						--limit;
					case 2:
						rc_bit(probs[symbol], 0,
							rep0 += 1 << offset,
							SEQ_POS_MODEL);
						++offset;
						--limit;
					case 1:
						// We need "symbol" only for
						// indexing the probability
						// array, thus we can use
						// rc_bit_last() here to omit
						// the unneeded updating of
						// "symbol".
						rc_bit_last(probs[symbol], 0,
							rep0 += 1 << offset,
							SEQ_POS_MODEL);
					}
#endif
				} else {
					// The distance is >= 128. Decode the
					// lower bits without probabilities
					// except the lowest four bits.
					assert(symbol >= 14);
					assert(limit >= 6);
					limit -= ALIGN_BITS;
					assert(limit >= 2);
	case SEQ_DIRECT:
					// Not worth manual unrolling
					do {
						rc_direct(rep0, SEQ_DIRECT);
					} while (--limit > 0);

					// Decode the lowest four bits using
					// probabilities.
					rep0 <<= ALIGN_BITS;
					symbol = 1;
#ifdef HAVE_SMALL
					offset = 0;
	case SEQ_ALIGN:
					do {
						rc_bit(coder->pos_align[
								symbol], ,
							rep0 += 1 << offset,
							SEQ_ALIGN);
					} while (++offset < ALIGN_BITS);
#else
	case SEQ_ALIGN0:
					rc_bit(coder->pos_align[symbol], 0,
							rep0 += 1, SEQ_ALIGN0);
	case SEQ_ALIGN1:
					rc_bit(coder->pos_align[symbol], 0,
							rep0 += 2, SEQ_ALIGN1);
	case SEQ_ALIGN2:
					rc_bit(coder->pos_align[symbol], 0,
							rep0 += 4, SEQ_ALIGN2);
	case SEQ_ALIGN3:
					// Like in SEQ_POS_MODEL, we don't
					// need "symbol" for anything else
					// than indexing the probability array.
					rc_bit_last(coder->pos_align[symbol], 0,
							rep0 += 8, SEQ_ALIGN3);
#endif

					if (rep0 == UINT32_MAX) {
						// End of payload marker was
						// found. It must not be
						// present if uncompressed
						// size is known.
						if (coder->uncompressed_size
						!= LZMA_VLI_UNKNOWN) {
							ret = LZMA_DATA_ERROR;
							goto out;
						}

	case SEQ_EOPM:
						// LZMA1 stream with
						// end-of-payload marker.
						rc_normalize(SEQ_EOPM);
						ret = LZMA_STREAM_END;
						goto out;
					}
				}
			}

			// Validate the distance we just decoded.
			if (unlikely(!dict_is_distance_valid(&dict, rep0))) {
				ret = LZMA_DATA_ERROR;
				goto out;
			}

		} else {
			rc_update_1(coder->is_rep[state]);

			// Repeated match
			//
			// The match distance is a value that we have had
			// earlier. The latest four match distances are
			// available as rep0, rep1, rep2 and rep3. We will
			// now decode which of them is the new distance.
			//
			// There cannot be a match if we haven't produced
			// any output, so check that first.
			if (unlikely(!dict_is_distance_valid(&dict, 0))) {
				ret = LZMA_DATA_ERROR;
				goto out;
			}

	case SEQ_IS_REP0:
			rc_if_0(coder->is_rep0[state], SEQ_IS_REP0) {
				rc_update_0(coder->is_rep0[state]);
				// The distance is rep0.

	case SEQ_IS_REP0_LONG:
				rc_if_0(coder->is_rep0_long[state][pos_state],
						SEQ_IS_REP0_LONG) {
					rc_update_0(coder->is_rep0_long[
							state][pos_state]);

					update_short_rep(state);

	case SEQ_SHORTREP:
					if (unlikely(dict_put(&dict, dict_get(
							&dict, rep0)))) {
						coder->sequence = SEQ_SHORTREP;
						goto out;
					}

					continue;
				}

				// Repeating more than one byte at
				// distance of rep0.
				rc_update_1(coder->is_rep0_long[
						state][pos_state]);

			} else {
				rc_update_1(coder->is_rep0[state]);

	case SEQ_IS_REP1:
				// The distance is rep1, rep2 or rep3. Once
				// we find out which one of these three, it
				// is stored to rep0 and rep1, rep2 and rep3
				// are updated accordingly.
				rc_if_0(coder->is_rep1[state], SEQ_IS_REP1) {
					uint32_t distance;

					rc_update_0(coder->is_rep1[state]);

					distance = rep1;
					rep1 = rep0;
					rep0 = distance;

				} else {
					rc_update_1(coder->is_rep1[state]);
	case SEQ_IS_REP2:
					rc_if_0(coder->is_rep2[state],
							SEQ_IS_REP2) {
						uint32_t distance;

						rc_update_0(coder->is_rep2[
								state]);

						distance = rep2;
						rep2 = rep1;
						rep1 = rep0;
						rep0 = distance;

					} else {
						uint32_t distance;

						rc_update_1(coder->is_rep2[
								state]);

						distance = rep3;
						rep3 = rep2;
						rep2 = rep1;
						rep1 = rep0;
						rep0 = distance;
					}
				}
			}

			update_long_rep(state);

			// Decode the length of the repeated match.
			len_decode(len, coder->rep_len_decoder,
					pos_state, SEQ_REP_LEN);
		}

		/////////////////////////////////
		// Repeat from history buffer. //
		/////////////////////////////////

		// The length is always between these limits. There is no way
		// to trigger the algorithm to set len outside this range.
		assert(len >= MATCH_LEN_MIN);
		assert(len <= MATCH_LEN_MAX);

	case SEQ_COPY:
		// Repeat len bytes from distance of rep0.
		if (unlikely(dict_repeat(&dict, rep0, &len))) {
			coder->sequence = SEQ_COPY;
			goto out;
		}
	}

	rc_normalize(SEQ_NORMALIZE);
	coder->sequence = SEQ_IS_MATCH;

out:
	// Save state

	// NOTE: Must not copy dict.limit.
	dictptr->pos = dict.pos;
	dictptr->full = dict.full;

	rc_from_local(coder->rc, *in_pos);

	coder->state = state;
	coder->rep0 = rep0;
	coder->rep1 = rep1;
	coder->rep2 = rep2;
	coder->rep3 = rep3;

	coder->probs = probs;
	coder->symbol = symbol;
	coder->limit = limit;
	coder->offset = offset;
	coder->len = len;

	// Update the remaining amount of uncompressed data if uncompressed
	// size was known.
	if (coder->uncompressed_size != LZMA_VLI_UNKNOWN) {
		coder->uncompressed_size -= dict.pos - dict_start;

		// Since there cannot be end of payload marker if the
		// uncompressed size was known, we check here if we
		// finished decoding.
		if (coder->uncompressed_size == 0 && ret == LZMA_OK
				&& coder->sequence != SEQ_NORMALIZE)
			ret = coder->sequence == SEQ_IS_MATCH
					? LZMA_STREAM_END : LZMA_DATA_ERROR;
	}

	// We can do an additional check in the range decoder to catch some
	// corrupted files.
	if (ret == LZMA_STREAM_END) {
		if (!rc_is_finished(coder->rc))
			ret = LZMA_DATA_ERROR;

		// Reset the range decoder so that it is ready to reinitialize
		// for a new LZMA2 chunk.
		rc_reset(coder->rc);
	}

	return ret;
}